

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  SyntaxList<slang::syntax::SyntaxNode> *args_5;
  BlockStatementSyntax *pBVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor_1;
  NamedBlockClauseSyntax *local_40;
  DeepCloneVisitor visitor;
  NamedLabelSyntax *local_28;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_28 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_28 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&visitor,(BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    local_40 = (NamedBlockClauseSyntax *)0x0;
  }
  else {
    local_40 = (NamedBlockClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x68),&visitor_1,(BumpAllocator *)__child_stack);
  }
  args_5 = deepClone<slang::syntax::SyntaxNode>
                     ((SyntaxList<slang::syntax::SyntaxNode> *)(__fn + 0x70),
                      (BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xb8) == (SyntaxNode *)0x0) {
    _visitor_2 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_2 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0xb8),&visitor_2,(BumpAllocator *)__child_stack)
    ;
  }
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BlockStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_28,args_2,
                      (Token *)&visitor,&local_40,args_5,(Token *)&visitor_1,
                      (NamedBlockClauseSyntax **)&visitor_2);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BlockStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BlockStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.begin.deepClone(alloc),
        node.blockName ? deepClone(*node.blockName, alloc) : nullptr,
        *deepClone(node.items, alloc),
        node.end.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}